

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_alpha_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  uint uVar3;
  unsigned_long_long *puVar4;
  unsigned_short *puVar5;
  vector<unsigned_short> *in_RDX;
  symbol_codec *in_RSI;
  long in_RDI;
  uint64 i_2;
  uint64 prev_selector_1;
  uint64 selector_1;
  uint64 c_1;
  symbol_codec codec;
  static_huffman_data_model dm;
  uint64 i_1;
  uint64 prev_selector;
  uint64 selector;
  uint64 c;
  symbol_histogram hist;
  uint i;
  vector<unsigned_long_long> remapped_selectors;
  undefined4 in_stack_fffffffffffffe18;
  uint in_stack_fffffffffffffe1c;
  symbol_codec *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  static_huffman_data_model *in_stack_fffffffffffffe30;
  symbol_codec *this_00;
  symbol_codec *in_stack_fffffffffffffe40;
  ulong uVar6;
  ulong local_160;
  symbol_codec *local_158;
  long local_148;
  symbol_codec local_140;
  static_huffman_data_model local_a8;
  ulong local_70;
  ulong local_68;
  static_huffman_data_model *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  long lVar7;
  undefined1 simulate;
  static_huffman_data_model *in_stack_ffffffffffffffb0;
  symbol_codec *in_stack_ffffffffffffffb8;
  uint local_2c;
  vector<unsigned_long_long> local_28;
  vector<unsigned_short> *local_18;
  symbol_codec *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  vector<unsigned_long_long>::size((vector<unsigned_long_long> *)(in_RDI + 0x1520));
  vector<unsigned_long_long>::vector
            ((vector<unsigned_long_long> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  local_2c = 0;
  while( true ) {
    uVar3 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)(in_RDI + 0x1520));
    if (uVar3 <= local_2c) break;
    puVar4 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)(in_RDI + 0x1520),local_2c);
    uVar1 = *puVar4;
    puVar5 = vector<unsigned_short>::operator[](local_18,local_2c);
    puVar4 = vector<unsigned_long_long>::operator[](&local_28,(uint)*puVar5);
    *puVar4 = uVar1;
    local_2c = local_2c + 1;
  }
  symbol_histogram::symbol_histogram
            ((symbol_histogram *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  local_68 = 0;
  local_70 = 0;
  while( true ) {
    uVar6 = local_70;
    simulate = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
    uVar3 = vector<unsigned_long_long>::size(&local_28);
    uVar2 = local_68;
    if (uVar3 <= uVar6) break;
    puVar4 = vector<unsigned_long_long>::operator[](&local_28,(uint)local_70);
    in_stack_ffffffffffffffa0 = (static_huffman_data_model *)(uVar2 ^ *puVar4);
    local_68 = (ulong)in_stack_ffffffffffffffa0 ^ local_68;
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
      symbol_histogram::inc_freq
                ((symbol_histogram *)in_stack_fffffffffffffe30,
                 (uint)((ulong)in_stack_fffffffffffffe28 >> 0x20),(uint)in_stack_fffffffffffffe28);
      in_stack_ffffffffffffffa0 =
           (static_huffman_data_model *)((ulong)in_stack_ffffffffffffffa0 >> 6);
    }
    local_70 = local_70 + 1;
    in_stack_ffffffffffffffa8 = 0;
  }
  static_huffman_data_model::static_huffman_data_model(in_stack_fffffffffffffe30);
  static_huffman_data_model::init(&local_a8,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(in_stack_fffffffffffffe40);
  symbol_codec::start_encoding(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  symbol_codec::encode_transmit_static_huffman_data_model
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(bool)simulate,
             in_stack_ffffffffffffffa0);
  local_158 = (symbol_codec *)0x0;
  local_160 = 0;
  while( true ) {
    uVar6 = local_160;
    uVar3 = vector<unsigned_long_long>::size(&local_28);
    if (uVar3 <= uVar6) break;
    this_00 = local_158;
    puVar4 = vector<unsigned_long_long>::operator[](&local_28,(uint)local_160);
    local_158 = (symbol_codec *)((ulong)this_00 ^ *puVar4 ^ (ulong)local_158);
    for (local_148 = 8; local_148 != 0; local_148 = local_148 + -1) {
      symbol_codec::encode
                (this_00,(uint)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                 (static_huffman_data_model *)in_stack_fffffffffffffe20);
    }
    local_160 = local_160 + 1;
  }
  symbol_codec::stop_encoding(in_stack_fffffffffffffe20,SUB41(in_stack_fffffffffffffe1c >> 0x18,0));
  symbol_codec::get_encoding_buf(&local_140);
  vector<unsigned_char>::swap
            ((vector<unsigned_char> *)local_10,
             (vector<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
  ;
  symbol_codec::~symbol_codec(local_10);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)local_10);
  symbol_histogram::~symbol_histogram((symbol_histogram *)0x1c99b1);
  vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)local_10);
  return true;
}

Assistant:

bool crn_comp::pack_alpha_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping) {
  crnlib::vector<uint64> remapped_selectors(m_alpha_selectors.size());
  for (uint i = 0; i < m_alpha_selectors.size(); i++)
    remapped_selectors[remapping[i]] = m_alpha_selectors[i];
  symbol_histogram hist(64);
  for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
      hist.inc_freq(selector & 0x3F);
  }
  static_huffman_data_model dm;
  dm.init(true, hist, 15);
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
      codec.encode(selector & 0x3F, dm);
  }
  codec.stop_encoding(false);
  packed_data.swap(codec.get_encoding_buf());
  return true;
}